

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int StopOtherScanThreadRPLIDARx(RPLIDAR *pRPLIDAR)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = RPLIDARCS;
  lVar1 = 0;
  do {
    if (*(RPLIDAR **)((long)addrsRPLIDAR + lVar1 * 2) == pRPLIDAR) {
      *(undefined4 *)((long)bExitOtherScanRPLIDAR + lVar1) = 1;
      pthread_join(*(pthread_t *)((long)RPLIDAROtherScanThreadId + lVar1 * 2),(void **)0x0);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resRPLIDAR + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopOtherScanThreadRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitOtherScanRPLIDAR[id] = TRUE;
	WaitForThread(RPLIDAROtherScanThreadId[id]);
	DeleteCriticalSection(&RPLIDARCS[id]);
	resRPLIDAR[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}